

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

json_null __thiscall json_deserializer::deserialize_null(json_deserializer *this)

{
  char cVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  iterator __result;
  ostream *poVar3;
  json_reader *in_RSI;
  int local_48;
  int i;
  undefined1 local_38 [8];
  string str;
  json_deserializer *this_local;
  
  std::__cxx11::string::string((string *)local_38);
  cVar1 = json_reader::current(in_RSI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,cVar1);
  for (local_48 = 1; local_48 < 4; local_48 = local_48 + 1) {
    json_reader::next(in_RSI);
    cVar1 = json_reader::current(in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,cVar1);
  }
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38)
  ;
  __result = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__result._M_current,tolower);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"null");
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Expected \'null\', found ");
    poVar3 = std::operator<<(poVar3,(string *)local_38);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  json_null::json_null((json_null *)this,&json_null_instance);
  std::__cxx11::string::~string((string *)local_38);
  return (json_null)(json_element)this;
}

Assistant:

json_null deserialize_null() {
        string str;
        str += reader.current();
        int i = 1;
        while (i < 4) {
            reader.next();
            str += reader.current();
            i++;
        }
        transform(str.begin(), str.end(), str.begin(), ::tolower);
        if (str != "null") {
            cerr << "Expected 'null', found " << str << endl;
        }
        return json_null_instance;
    }